

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O1

NLW2_NLSolution_C *
NLW2_WrapNLSOL_Solution_C
          (NLW2_NLSolution_C *__return_storage_ptr__,NLW2_NLSolver_C *nlse,NLSolution *sol)

{
  size_type __n;
  undefined8 uVar1;
  iterator __position;
  double *pdVar2;
  undefined8 *puVar3;
  _Rb_tree_node_base *p_Var4;
  NLSolution *sol_1;
  NLW2_NLSuffix_C suf_c;
  NLW2_NLSuffix_C local_50;
  
  if (nlse->p_sol_ == (void *)0x0) {
    puVar3 = (undefined8 *)operator_new(0xa8);
    *puVar3 = 0xfffffffe;
    puVar3[1] = puVar3 + 3;
    puVar3[2] = 0;
    *(undefined1 *)(puVar3 + 3) = 0;
    *(undefined4 *)(puVar3 + 0xd) = 0;
    puVar3[0xe] = 0;
    puVar3[5] = 0;
    puVar3[6] = 0;
    puVar3[7] = 0;
    puVar3[8] = 0;
    puVar3[9] = 0;
    puVar3[10] = 0;
    puVar3[0xb] = 0;
    puVar3[0xf] = puVar3 + 0xd;
    puVar3[0x10] = puVar3 + 0xd;
    puVar3[0x11] = 0;
    puVar3[0x12] = 0;
    puVar3[0x13] = 0;
    puVar3[0x14] = 0;
    nlse->p_sol_ = puVar3;
  }
  puVar3 = (undefined8 *)nlse->p_sol_;
  *puVar3 = *(undefined8 *)sol;
  std::__cxx11::string::operator=((string *)(puVar3 + 1),(string *)&sol->solve_message_);
  puVar3[5] = sol->obj_val_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)(puVar3 + 6),&sol->x_);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)(puVar3 + 9),&sol->y_);
  std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::operator=
            ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)
             (puVar3 + 0xc),
             &(sol->suffixes_).
              super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>);
  __n = puVar3[0x11];
  __return_storage_ptr__->nsuf_ = (int)__n;
  __return_storage_ptr__->obj_val_ = (double)puVar3[5];
  __return_storage_ptr__->solve_message_ = (char *)puVar3[1];
  uVar1 = *puVar3;
  __return_storage_ptr__->solve_result_ = (int)uVar1;
  __return_storage_ptr__->nbs_ = (int)((ulong)uVar1 >> 0x20);
  if (puVar3[0x13] != puVar3[0x12]) {
    puVar3[0x13] = puVar3[0x12];
  }
  std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::reserve
            ((vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_> *)(puVar3 + 0x12),__n);
  __return_storage_ptr__->suffixes_ = (NLW2_NLSuffix_C *)puVar3[0x12];
  p_Var4 = (_Rb_tree_node_base *)puVar3[0xf];
  if (p_Var4 != (_Rb_tree_node_base *)(puVar3 + 0xd)) {
    do {
      local_50.kind_ = p_Var4[3]._M_color;
      local_50.name_ = *(char **)(p_Var4 + 1);
      local_50.table_ = *(char **)(p_Var4 + 2);
      local_50.values_ = (double *)p_Var4[3]._M_parent;
      local_50.numval_ = (int)((ulong)((long)p_Var4[3]._M_left - (long)local_50.values_) >> 3);
      __position._M_current = (NLW2_NLSuffix_C *)puVar3[0x13];
      if (__position._M_current == (NLW2_NLSuffix_C *)puVar3[0x14]) {
        std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::
        _M_realloc_insert<NLW2_NLSuffix_C>
                  ((vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_> *)(puVar3 + 0x12),
                   __position,&local_50);
      }
      else {
        (__position._M_current)->kind_ = local_50.kind_;
        (__position._M_current)->numval_ = local_50.numval_;
        (__position._M_current)->values_ = local_50.values_;
        (__position._M_current)->name_ = local_50.name_;
        (__position._M_current)->table_ = local_50.table_;
        puVar3[0x13] = puVar3[0x13] + 0x20;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)(puVar3 + 0xd));
  }
  pdVar2 = (double *)puVar3[6];
  __return_storage_ptr__->n_primal_values_ = (int)((ulong)(puVar3[7] - (long)pdVar2) >> 3);
  __return_storage_ptr__->x_ = pdVar2;
  pdVar2 = (double *)puVar3[9];
  __return_storage_ptr__->n_dual_values_ = (int)((ulong)(puVar3[10] - (long)pdVar2) >> 3);
  __return_storage_ptr__->y_ = pdVar2;
  return __return_storage_ptr__;
}

Assistant:

static NLW2_NLSolution_C NLW2_WrapNLSOL_Solution_C
(NLW2_NLSolver_C* nlse, mp::NLSolution sol) {
  // Store the C++ data
  if (!nlse->p_sol_)
    nlse->p_sol_ = new mp::NLW2_Solution_C_Data;
  auto& sol_data = *CastNZ<mp::NLW2_Solution_C_Data>(nlse->p_sol_);
  sol_data.sol_ = std::move(sol);

  NLW2_NLSolution_C result;
  {
    const auto& sol=sol_data.sol_;
    result.nbs_ = sol.nbs_;
    result.nsuf_ = sol.suffixes_.size();
    result.obj_val_ = sol.obj_val_;
    result.solve_message_ = sol.solve_message_.c_str();
    result.solve_result_ = sol.solve_result_;
    sol_data.suffixes_.clear();
    sol_data.suffixes_.reserve(sol.suffixes_.size());
    result.suffixes_ = sol_data.suffixes_.data();
    for (const auto& suf: sol.suffixes_) {
      NLW2_NLSuffix_C suf_c;
      suf_c.kind_ = suf.kind_;
      suf_c.name_ = suf.name_.c_str();
      suf_c.table_ = suf.table_.c_str();
      suf_c.numval_ = suf.values_.size();
      suf_c.values_ = suf.values_.data();
      sol_data.suffixes_.push_back(std::move(suf_c));
    }
    result.n_primal_values_ = sol.x_.size();
    result.x_ = sol.x_.data();
    result.n_dual_values_ = sol.y_.size();
    result.y_ = sol.y_.data();
  }
  return result;
}